

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Flip
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical)

{
  uint uVar1;
  uint uVar2;
  EVP_PKEY_CTX *src;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  ImageTemplate<unsigned_char> local_58;
  
  uVar10 = (ulong)startXOut;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if (horizontal || vertical) {
    uVar1 = in->_rowSize;
    uVar11 = (ulong)uVar1;
    uVar2 = out->_rowSize;
    uVar5 = (ulong)uVar2;
    puVar9 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar1);
    uVar8 = (ulong)(uVar1 * height);
    puVar4 = puVar9 + uVar8;
    if (horizontal && !vertical) {
      if (uVar8 != 0) {
        puVar3 = out->_data + ((ulong)width - 1) + uVar10 + startYOut * uVar2;
        do {
          if (width != 0) {
            lVar6 = 0;
            puVar7 = puVar9;
            do {
              puVar3[lVar6] = *puVar7;
              puVar7 = puVar7 + 1;
              lVar6 = lVar6 + -1;
            } while (-lVar6 != (ulong)width);
          }
          puVar9 = puVar9 + uVar11;
          puVar3 = puVar3 + uVar5;
        } while (puVar9 != puVar4);
      }
    }
    else if (vertical && !horizontal) {
      if (uVar8 != 0) {
        puVar4 = out->_data + uVar10 + ((startYOut - 1) + height) * uVar2;
        uVar10 = 0;
        do {
          memcpy(puVar4,puVar9 + uVar10,(ulong)width);
          puVar4 = puVar4 + -uVar5;
          uVar10 = uVar10 + uVar11;
        } while (uVar8 != uVar10);
      }
    }
    else if (uVar8 != 0) {
      puVar3 = out->_data + ((ulong)width - 1) + uVar10 + ((startYOut - 1) + height) * uVar2;
      do {
        if (width != 0) {
          lVar6 = 0;
          puVar7 = puVar9;
          do {
            puVar3[lVar6] = *puVar7;
            puVar7 = puVar7 + 1;
            lVar6 = lVar6 + -1;
          } while (-lVar6 != (ulong)width);
        }
        puVar9 = puVar9 + uVar11;
        puVar3 = puVar3 + -uVar5;
      } while (puVar9 != puVar4);
    }
  }
  else {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            if( horizontal && !vertical ) {
                uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
            else if( !horizontal && vertical ) {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                    memcpy( outY, inY, sizeof( uint8_t ) * width );
            }
            else {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }